

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

string * __thiscall
llvm::ErrorInfoBase::message_abi_cxx11_(string *__return_storage_ptr__,ErrorInfoBase *this)

{
  string *psVar1;
  undefined1 local_68 [8];
  raw_string_ostream OS;
  string Msg;
  ErrorInfoBase *this_local;
  
  std::__cxx11::string::string((string *)&OS.OS);
  raw_string_ostream::raw_string_ostream((raw_string_ostream *)local_68,(string *)&OS.OS);
  (*this->_vptr_ErrorInfoBase[2])(this,local_68);
  psVar1 = raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_68);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_68);
  std::__cxx11::string::~string((string *)&OS.OS);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string message() const {
    std::string Msg;
    raw_string_ostream OS(Msg);
    log(OS);
    return OS.str();
  }